

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

bool I_InitNetwork(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  in_addr *piVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  
  memset(&doomcom,0,0x36c4);
  pcVar5 = DArgs::CheckValue(Args,"-dup");
  if (pcVar5 == (char *)0x0) {
    doomcom.ticdup = 1;
  }
  else {
    iVar2 = atoi(pcVar5);
    iVar4 = 5;
    if (iVar2 < 5) {
      iVar4 = iVar2;
    }
    doomcom.ticdup = 1;
    if (1 < iVar4) {
      doomcom.ticdup = (SWORD)iVar4;
    }
  }
  pcVar5 = DArgs::CheckValue(Args,"-port");
  if (pcVar5 != (char *)0x0) {
    uVar3 = atoi(pcVar5);
    DOOMPORT = (u_short)uVar3;
    Printf("using alternate port %i\n",(ulong)(uVar3 & 0xffff));
  }
  iVar4 = DArgs::CheckParm(Args,"-host",1);
  if (iVar4 == 0) {
    iVar4 = DArgs::CheckParm(Args,"-join",1);
    if (iVar4 == 0) {
      doomcom.id = 0x12345678;
      doomcom.numnodes = 1;
      doomcom.consoleplayer = 0;
      doomcom.numplayers = 1;
      netgame = false;
      multiplayer = false;
      return false;
    }
    JoinGame(iVar4);
  }
  else {
    HostGame(iVar4);
  }
  if (doomcom.numnodes < 3) {
    bVar10 = false;
  }
  else {
    bVar10 = true;
    if (doomcom.numnodes == 3) {
      uVar3 = (sendaddress[1].sin_addr.s_addr & 0xff00) << 8;
      uVar1 = sendaddress[1].sin_addr.s_addr << 0x18;
      uVar6 = 0xc0a80000;
      if (((uVar3 | uVar1) != 0xc0a80000) &&
         (uVar6 = 0xac100000, (uVar3 & 0xfff00000 | uVar1) != 0xac100000)) {
        uVar6 = 0;
        if (uVar1 == 0x7f000000) {
          uVar6 = uVar1;
        }
        if (uVar1 == 0xa000000) {
          uVar6 = uVar1;
        }
      }
      if (uVar6 != 0) {
        piVar8 = &sendaddress[2].sin_addr;
        bVar10 = false;
        uVar7 = 3;
        do {
          uVar3 = (piVar8->s_addr & 0xff00) << 8;
          uVar1 = piVar8->s_addr << 0x18;
          uVar9 = 0xc0a80000;
          if (((uVar3 | uVar1) != 0xc0a80000) &&
             (uVar9 = 0xac100000, (uVar3 & 0xfff00000 | uVar1) != 0xac100000)) {
            uVar9 = 0;
            if (uVar1 == 0x7f000000) {
              uVar9 = uVar1;
            }
            if (uVar1 == 0xa000000) {
              uVar9 = uVar1;
            }
          }
          if (uVar9 != uVar6) break;
          bVar10 = (ushort)doomcom.numnodes <= uVar7;
          piVar8 = piVar8 + 4;
          bVar11 = uVar7 != (ushort)doomcom.numnodes;
          uVar7 = uVar7 + 1;
        } while (bVar11);
        bVar10 = (bool)(bVar10 ^ 1);
      }
    }
  }
  return bVar10;
}

Assistant:

bool I_InitNetwork (void)
{
	int i;
	const char *v;

	memset (&doomcom, 0, sizeof(doomcom));

	// set up for network
	v = Args->CheckValue ("-dup");
	if (v)
	{
		doomcom.ticdup = clamp (atoi (v), 1, MAXTICDUP);
	}
	else
	{
		doomcom.ticdup = 1;
	}

	v = Args->CheckValue ("-port");
	if (v)
	{
		DOOMPORT = atoi (v);
		Printf ("using alternate port %i\n", DOOMPORT);
	}

	// parse network game options,
	//		player 1: -host <numplayers>
	//		player x: -join <player 1's address>
	if ( (i = Args->CheckParm ("-host")) )
	{
		HostGame (i);
	}
	else if ( (i = Args->CheckParm ("-join")) )
	{
		JoinGame (i);
	}
	else
	{
		// single player game
		netgame = false;
		multiplayer = false;
		doomcom.id = DOOMCOM_ID;
		doomcom.numplayers = doomcom.numnodes = 1;
		doomcom.consoleplayer = 0;
		return false;
	}
	if (doomcom.numnodes < 3)
	{ // Packet server mode with only two players is effectively the same as
	  // peer-to-peer but with some slightly larger packets.
		return false;
	}
	return doomcom.numnodes > 3 || !NodesOnSameNetwork();
}